

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_open_res_raw(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_obj_id_t self_00;
  vm_rcdesc rc;
  
  self_00 = CVmMetaclass::get_class_obj(metaclass_reg_);
  vm_rcdesc::vm_rcdesc(&rc,"File.openRawResource",self_00,0xf,sp_ + -1,argc);
  s_getp_open_raw(retval,argc,1,&rc);
  return 1;
}

Assistant:

int CVmObjFile::getp_open_res_raw(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc)
{
    vm_rcdesc rc(vmg_ "File.openRawResource",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_OPEN_RES_RAW, G_stk->get(0), argc);
    return s_getp_open_raw(vmg_ retval, argc, TRUE, &rc);
}